

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void amrex::MLABecLaplacian::FFlux
               (Box *box,Real *dxinv,Real bscalar,Array<const_FArrayBox_*,_3> *bcoef,
               Array<FArrayBox_*,_3> *flux,FArrayBox *sol,int face_only,int ncomp)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  FArrayBox *pFVar11;
  FArrayBox *pFVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  undefined8 uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  int iVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  int iVar72;
  long lVar73;
  ulong uVar74;
  double *pdVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  double *local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  double *local_1b0;
  long local_1a0;
  long local_178;
  long local_160;
  long local_148;
  long local_140;
  ulong local_138;
  long local_130;
  long local_100;
  long local_f8;
  long local_e0;
  long local_d8;
  
  pFVar11 = bcoef->_M_elems[0];
  pFVar12 = bcoef->_M_elems[1];
  pdVar75 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar51 = (long)iVar2;
  iVar28 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  iVar72 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar52 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar53 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar28) + 1);
  lVar46 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar72) + 1);
  pdVar13 = (pFVar12->super_BaseFab<double>).dptr;
  iVar2 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[0];
  lVar54 = (long)iVar2;
  iVar20 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[1];
  lVar67 = (long)iVar20;
  iVar43 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[2];
  lVar47 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar48 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[1] - iVar20) + 1);
  lVar21 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[2] - iVar43) + 1);
  pFVar11 = bcoef->_M_elems[2];
  pdVar14 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar59 = (long)iVar2;
  iVar20 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar68 = (long)iVar20;
  iVar45 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar35 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar36 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar20) + 1);
  lVar22 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar45) + 1);
  pFVar11 = flux->_M_elems[0];
  pdVar15 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar44 = (long)iVar2;
  iVar20 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  iVar76 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar37 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar38 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar20) + 1);
  lVar23 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar76) + 1);
  pFVar11 = flux->_M_elems[1];
  pdVar16 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar60 = (long)iVar2;
  iVar57 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar55 = (long)iVar57;
  iVar3 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar39 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar40 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar57) + 1);
  lVar24 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
  pFVar11 = flux->_M_elems[2];
  pdVar17 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar49 = (long)iVar2;
  iVar57 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar61 = (long)iVar57;
  iVar4 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar29 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar30 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar57) + 1);
  lVar25 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  pdVar18 = (sol->super_BaseFab<double>).dptr;
  uVar5 = (sol->super_BaseFab<double>).domain.smallend.vect[0];
  lVar77 = (long)(int)uVar5;
  uVar6 = (sol->super_BaseFab<double>).domain.smallend.vect[1];
  lVar62 = (long)(int)uVar6;
  uVar7 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
  lVar50 = (long)(int)uVar7;
  lVar26 = (long)(int)(((sol->super_BaseFab<double>).domain.bigend.vect[0] - uVar5) + 1);
  lVar31 = (long)(int)(((sol->super_BaseFab<double>).domain.bigend.vect[1] - uVar6) + 1);
  lVar32 = lVar31 * lVar26;
  lVar27 = (int)(((sol->super_BaseFab<double>).domain.bigend.vect[2] - uVar7) + 1) * lVar32;
  if (face_only == 0) {
    if (0 < ncomp) {
      uVar8 = (box->btype).itype;
      iVar2 = (box->bigend).vect[1];
      iVar57 = (box->bigend).vect[2];
      iVar42 = (box->smallend).vect[2];
      lVar65 = (long)iVar42;
      iVar9 = (box->smallend).vect[1];
      iVar10 = (box->smallend).vect[0];
      lVar33 = (long)iVar10;
      iVar66 = (~uVar8 & 1) + (box->bigend).vect[0];
      dVar1 = *dxinv;
      lVar56 = (long)iVar9 * 8;
      local_178 = (long)pdVar75 +
                  (lVar56 + (lVar65 - iVar72) * lVar53 * 8 + (long)iVar28 * -8) * lVar52 +
                  lVar33 * 8 + lVar51 * -8;
      uVar34 = (ulong)(uint)ncomp;
      local_130 = (lVar56 + (lVar65 - lVar50) * lVar31 * 8 + lVar62 * -8) * lVar26 + lVar33 * 8 +
                  lVar77 * -8 + (long)pdVar18;
      lVar51 = lVar27 * 8;
      local_1a0 = (long)pdVar15 +
                  (lVar56 + (lVar65 - iVar76) * lVar38 * 8 + (long)iVar20 * -8) * lVar37 +
                  lVar33 * 8 + lVar44 * -8;
      lVar44 = lVar32 * 8;
      lVar56 = lVar26 * 8;
      local_138 = 0;
      do {
        if (iVar42 <= iVar57) {
          local_1f8 = (double *)local_1a0;
          local_218 = local_130;
          local_200 = local_178;
          lVar33 = lVar65;
          do {
            if (iVar9 <= iVar2) {
              lVar63 = (long)iVar9;
              lVar69 = local_218;
              lVar70 = local_200;
              pdVar75 = local_1f8;
              do {
                if (iVar10 <= iVar66) {
                  lVar58 = 0;
                  do {
                    *(double *)((long)pdVar75 + lVar58 * 8) =
                         (*(double *)(lVar69 + lVar58 * 8) -
                         pdVar18[lVar27 * local_138 +
                                 (lVar33 - lVar50) * lVar32 +
                                 (lVar63 - lVar62) * lVar26 +
                                 (long)(int)(~uVar5 + iVar10 + (int)lVar58)]) *
                         *(double *)(lVar70 + lVar58 * 8) * -dVar1 * bscalar;
                    lVar58 = lVar58 + 1;
                  } while ((iVar66 - iVar10) + 1 != (int)lVar58);
                }
                lVar63 = lVar63 + 1;
                lVar70 = lVar70 + lVar52 * 8;
                lVar69 = lVar69 + lVar56;
                pdVar75 = (double *)((long)pdVar75 + lVar37 * 8);
              } while (iVar2 + 1 != (int)lVar63);
            }
            lVar33 = lVar33 + 1;
            local_200 = local_200 + lVar53 * lVar52 * 8;
            local_218 = local_218 + lVar44;
            local_1f8 = (double *)((long)local_1f8 + lVar38 * lVar37 * 8);
          } while (iVar57 + 1 != (int)lVar33);
        }
        local_138 = local_138 + 1;
        local_178 = local_178 + lVar46 * lVar53 * lVar52 * 8;
        local_130 = local_130 + lVar51;
        local_1a0 = local_1a0 + lVar23 * lVar38 * lVar37 * 8;
      } while (local_138 != uVar34);
      if (0 < ncomp) {
        iVar2 = (box->bigend).vect[2];
        iVar28 = (box->bigend).vect[0];
        iVar72 = (box->smallend).vect[2];
        lVar37 = (long)iVar72;
        iVar57 = (box->bigend).vect[1] + (uint)((uVar8 & 2) == 0);
        iVar20 = (box->smallend).vect[1];
        dVar1 = dxinv[1];
        iVar76 = (box->smallend).vect[0];
        lVar46 = (long)iVar76;
        lVar23 = (long)iVar20 * 8;
        local_100 = (long)pdVar13 +
                    (lVar23 + (lVar37 - iVar43) * lVar48 * 8 + lVar67 * -8) * lVar47 + lVar46 * 8 +
                    lVar54 * -8;
        lVar38 = (lVar37 - lVar50) * lVar31;
        local_1c8 = (lVar23 + lVar38 * 8 + lVar62 * -8) * lVar26 + lVar46 * 8 + lVar77 * -8 +
                    (long)pdVar18;
        local_1b0 = pdVar18 + (lVar46 - lVar77);
        local_160 = (long)pdVar16 +
                    (lVar23 + (lVar37 - iVar3) * lVar40 * 8 + lVar55 * -8) * lVar39 + lVar46 * 8 +
                    lVar60 * -8;
        uVar41 = 0;
        do {
          lVar23 = lVar37;
          lVar46 = local_160;
          lVar52 = local_100;
          pdVar75 = local_1b0;
          lVar53 = local_1c8;
          if (iVar72 <= iVar2) {
            do {
              lVar54 = lVar46;
              lVar55 = lVar52;
              lVar60 = (long)iVar20;
              lVar67 = lVar53;
              iVar43 = ~uVar6 + iVar20;
              if (iVar20 <= iVar57) {
                do {
                  if (iVar76 <= iVar28) {
                    lVar65 = 0;
                    do {
                      *(double *)(lVar54 + lVar65 * 8) =
                           (*(double *)(lVar67 + lVar65 * 8) -
                           *(double *)
                            ((long)pdVar75 + lVar65 * 8 + (lVar38 * 8 + (long)iVar43 * 8) * lVar26))
                           * *(double *)(lVar55 + lVar65 * 8) * -dVar1 * bscalar;
                      lVar65 = lVar65 + 1;
                    } while ((iVar28 - iVar76) + 1 != (int)lVar65);
                  }
                  lVar60 = lVar60 + 1;
                  lVar55 = lVar55 + lVar47 * 8;
                  lVar67 = lVar67 + lVar56;
                  iVar43 = iVar43 + 1;
                  lVar54 = lVar54 + lVar39 * 8;
                } while (iVar57 + 1 != (int)lVar60);
              }
              lVar23 = lVar23 + 1;
              lVar46 = lVar46 + lVar40 * lVar39 * 8;
              lVar52 = lVar52 + lVar48 * lVar47 * 8;
              pdVar75 = pdVar75 + lVar32;
              lVar53 = lVar53 + lVar44;
            } while (iVar2 + 1 != (int)lVar23);
          }
          uVar41 = uVar41 + 1;
          local_100 = local_100 + lVar21 * lVar48 * lVar47 * 8;
          local_1c8 = local_1c8 + lVar51;
          local_1b0 = local_1b0 + lVar27;
          local_160 = local_160 + lVar24 * lVar40 * lVar39 * 8;
        } while (uVar41 != uVar34);
        if (0 < ncomp) {
          iVar2 = (box->smallend).vect[2];
          lVar24 = (long)iVar2;
          iVar28 = (box->smallend).vect[1];
          iVar76 = (box->bigend).vect[2] + (uint)((uVar8 & 4) == 0);
          dVar1 = dxinv[2];
          lVar21 = (long)iVar28 * 8;
          iVar72 = (box->smallend).vect[0];
          lVar23 = (long)iVar72;
          local_d8 = (long)pdVar14 +
                     (lVar21 + (lVar24 - iVar45) * lVar36 * 8 + lVar68 * -8) * lVar35 + lVar23 * 8 +
                     lVar59 * -8;
          iVar20 = (box->bigend).vect[0];
          iVar43 = (box->bigend).vect[1];
          local_1f8 = pdVar18 + (lVar23 - lVar77);
          local_1c0 = (lVar21 + (lVar24 - lVar50) * lVar31 * 8 + lVar62 * -8) * lVar26 + lVar23 * 8
                      + lVar77 * -8 + (long)pdVar18;
          local_e0 = (long)pdVar17 +
                     (lVar21 + (lVar24 - iVar4) * lVar30 * 8 + lVar61 * -8) * lVar29 + lVar23 * 8 +
                     lVar49 * -8;
          uVar41 = 0;
          do {
            if (iVar2 <= iVar76) {
              local_220 = local_e0;
              local_210 = local_1c0;
              lVar23 = lVar24;
              lVar32 = local_d8;
              iVar45 = ~uVar7 + iVar2;
              do {
                if (iVar28 <= iVar43) {
                  pdVar75 = (double *)
                            (((long)iVar45 * lVar31 * 8 + lVar21 + lVar62 * -8) * lVar26 +
                            (long)local_1f8);
                  lVar37 = local_220;
                  lVar38 = (long)iVar28;
                  lVar39 = lVar32;
                  lVar40 = local_210;
                  do {
                    if (iVar72 <= iVar20) {
                      lVar46 = 0;
                      do {
                        *(double *)(lVar37 + lVar46 * 8) =
                             (*(double *)(lVar40 + lVar46 * 8) - pdVar75[lVar46]) *
                             *(double *)(lVar39 + lVar46 * 8) * -dVar1 * bscalar;
                        lVar46 = lVar46 + 1;
                      } while ((iVar20 - iVar72) + 1 != (int)lVar46);
                    }
                    lVar38 = lVar38 + 1;
                    lVar39 = lVar39 + lVar35 * 8;
                    pdVar75 = pdVar75 + lVar26;
                    lVar40 = lVar40 + lVar56;
                    lVar37 = lVar37 + lVar29 * 8;
                  } while (iVar43 + 1 != (int)lVar38);
                }
                lVar23 = lVar23 + 1;
                lVar32 = lVar32 + lVar36 * lVar35 * 8;
                iVar45 = iVar45 + 1;
                local_210 = local_210 + lVar44;
                local_220 = local_220 + lVar30 * lVar29 * 8;
              } while (iVar76 + 1 != (int)lVar23);
            }
            uVar41 = uVar41 + 1;
            local_d8 = local_d8 + lVar22 * lVar36 * lVar35 * 8;
            local_1f8 = local_1f8 + lVar27;
            local_1c0 = local_1c0 + lVar51;
            local_e0 = local_e0 + lVar25 * lVar30 * lVar29 * 8;
          } while (uVar41 != uVar34);
        }
      }
    }
  }
  else if (0 < ncomp) {
    uVar19 = *(undefined8 *)(box->bigend).vect;
    iVar2 = (box->smallend).vect[2];
    lVar69 = (long)iVar2;
    lVar65 = *(long *)(box->smallend).vect;
    lVar56 = (lVar65 >> 0x20) * 8;
    lVar33 = (lVar56 + (lVar69 - iVar72) * lVar53 * 8 + (long)iVar28 * -8) * lVar52;
    iVar72 = (int)uVar19;
    lVar63 = (long)(iVar72 + 1);
    lVar70 = (long)(int)lVar65;
    local_138 = lVar33 + lVar63 * 8 + lVar51 * -8 + (long)pdVar75;
    local_140 = lVar33 + lVar70 * 8 + lVar51 * -8 + (long)pdVar75;
    lVar33 = (lVar56 + (lVar69 - lVar50) * lVar31 * 8 + lVar62 * -8) * lVar26;
    lVar51 = (lVar56 + (lVar69 - iVar76) * lVar38 * 8 + (long)iVar20 * -8) * lVar37;
    iVar28 = (box->bigend).vect[2];
    dVar1 = *dxinv;
    local_148 = lVar51 + lVar63 * 8 + lVar44 * -8 + (long)pdVar15;
    local_f8 = lVar51 + lVar70 * 8 + lVar44 * -8 + (long)pdVar15;
    local_208._0_4_ = (int)((ulong)lVar65 >> 0x20);
    iVar20 = (int)local_208;
    iVar76 = (int)((ulong)uVar19 >> 0x20);
    iVar57 = iVar76 - (int)local_208;
    lVar44 = lVar46 * lVar53 * lVar52 * 8;
    lVar51 = lVar53 * lVar52 * 8;
    lVar27 = lVar27 * 8;
    lVar32 = lVar32 * 8;
    lVar46 = lVar23 * lVar38 * lVar37 * 8;
    lVar38 = lVar38 * lVar37 * 8;
    uVar34 = (ulong)(uint)ncomp;
    lVar23 = lVar26 * 8;
    local_1c8 = 0;
    uVar41 = 0;
    do {
      if (iVar2 <= iVar28) {
        local_208 = local_1c8;
        lVar53 = local_140;
        lVar56 = lVar69;
        lVar58 = local_f8;
        uVar74 = local_138;
        lVar78 = local_148;
        do {
          if (iVar20 <= iVar76) {
            lVar64 = 0;
            lVar71 = 0;
            lVar73 = local_208;
            iVar42 = iVar57 + 1;
            do {
              *(double *)(lVar58 + lVar64) =
                   (*(double *)((long)pdVar18 + lVar73 + lVar33 + lVar70 * 8 + lVar77 * -8) -
                   *(double *)
                    ((long)pdVar18 + lVar73 + lVar33 + (long)(int)(~uVar5 + (int)lVar65) * 8)) *
                   *(double *)(lVar53 + lVar71) * -dVar1 * bscalar;
              *(double *)(lVar78 + lVar64) =
                   (*(double *)((long)pdVar18 + lVar73 + lVar33 + lVar63 * 8 + lVar77 * -8) -
                   *(double *)((long)pdVar18 + lVar73 + lVar33 + (long)(int)(iVar72 - uVar5) * 8)) *
                   *(double *)(uVar74 + lVar71) * -dVar1 * bscalar;
              lVar71 = lVar71 + lVar52 * 8;
              lVar73 = lVar73 + lVar23;
              lVar64 = lVar64 + lVar37 * 8;
              iVar42 = iVar42 + -1;
            } while (iVar42 != 0);
          }
          lVar56 = lVar56 + 1;
          uVar74 = uVar74 + lVar51;
          lVar53 = lVar53 + lVar51;
          local_208 = local_208 + lVar32;
          lVar78 = lVar78 + lVar38;
          lVar58 = lVar58 + lVar38;
        } while (iVar28 + 1 != (int)lVar56);
      }
      uVar41 = uVar41 + 1;
      local_138 = local_138 + lVar44;
      local_140 = local_140 + lVar44;
      local_1c8 = local_1c8 + lVar27;
      local_148 = local_148 + lVar46;
      local_f8 = local_f8 + lVar46;
    } while (uVar41 != uVar34);
    if (0 < ncomp) {
      lVar37 = *(long *)(box->smallend).vect;
      iVar2 = (box->smallend).vect[2];
      lVar56 = (long)iVar2;
      lVar44 = (lVar56 - iVar43) * lVar48;
      lVar38 = (lVar37 >> 0x20) * 8;
      lVar52 = (long)(iVar76 + 1) * 8;
      iVar43 = (int)lVar37;
      lVar51 = (long)iVar43;
      lVar46 = (lVar38 + lVar44 * 8 + lVar67 * -8) * lVar47 + lVar51 * 8 + lVar54 * -8 +
               (long)pdVar13;
      lVar54 = (lVar52 + lVar44 * 8 + lVar67 * -8) * lVar47 + lVar51 * 8 + lVar54 * -8 +
               (long)pdVar13;
      lVar53 = (lVar56 - lVar50) * lVar31;
      lVar50 = (lVar56 - iVar3) * lVar40;
      iVar28 = (box->bigend).vect[0];
      dVar1 = dxinv[1];
      iVar72 = (box->bigend).vect[2];
      iVar20 = iVar72 + 1;
      lVar21 = lVar21 * lVar48 * lVar47 * 8;
      lVar48 = lVar48 * lVar47 * 8;
      lVar47 = (lVar38 + lVar53 * 8 + lVar62 * -8) * lVar26 + lVar51 * 8 + lVar77 * -8 +
               (long)pdVar18;
      lVar44 = ((long)(int)(~uVar6 + (int)((ulong)lVar37 >> 0x20)) * 8 + lVar53 * 8) * lVar26 +
               lVar51 * 8 + lVar77 * -8 + (long)pdVar18;
      lVar67 = (lVar38 + lVar50 * 8 + lVar55 * -8) * lVar39 + lVar51 * 8 + lVar60 * -8 +
               (long)pdVar16;
      lVar37 = lVar24 * lVar40 * lVar39 * 8;
      lVar38 = lVar40 * lVar39 * 8;
      iVar57 = (iVar28 - iVar43) + 1;
      lVar40 = (lVar52 + lVar53 * 8 + lVar62 * -8) * lVar26 + lVar51 * 8 + lVar77 * -8 +
               (long)pdVar18;
      lVar24 = ((long)(int)(iVar76 - uVar6) * 8 + lVar53 * 8) * lVar26 + lVar51 * 8 + lVar77 * -8 +
               (long)pdVar18;
      lVar39 = (lVar52 + lVar50 * 8 + lVar55 * -8) * lVar39 + lVar51 * 8 + lVar60 * -8 +
               (long)pdVar16;
      uVar41 = 0;
      do {
        lVar50 = lVar46;
        lVar51 = lVar56;
        lVar52 = lVar24;
        lVar53 = lVar44;
        lVar55 = lVar40;
        lVar60 = lVar47;
        lVar65 = lVar39;
        lVar33 = lVar67;
        lVar63 = lVar54;
        if (iVar2 <= iVar72) {
          do {
            if (iVar43 <= iVar28) {
              lVar69 = 0;
              do {
                *(double *)(lVar33 + lVar69 * 8) =
                     (*(double *)(lVar60 + lVar69 * 8) - *(double *)(lVar53 + lVar69 * 8)) *
                     *(double *)(lVar50 + lVar69 * 8) * -dVar1 * bscalar;
                lVar69 = lVar69 + 1;
              } while (iVar57 != (int)lVar69);
              if (iVar43 <= iVar28) {
                lVar69 = 0;
                do {
                  *(double *)(lVar65 + lVar69 * 8) =
                       (*(double *)(lVar55 + lVar69 * 8) - *(double *)(lVar52 + lVar69 * 8)) *
                       *(double *)(lVar63 + lVar69 * 8) * -dVar1 * bscalar;
                  lVar69 = lVar69 + 1;
                } while (iVar57 != (int)lVar69);
              }
            }
            lVar51 = lVar51 + 1;
            lVar50 = lVar50 + lVar48;
            lVar60 = lVar60 + lVar32;
            lVar53 = lVar53 + lVar32;
            lVar33 = lVar33 + lVar38;
            lVar63 = lVar63 + lVar48;
            lVar55 = lVar55 + lVar32;
            lVar52 = lVar52 + lVar32;
            lVar65 = lVar65 + lVar38;
          } while (iVar20 != (int)lVar51);
        }
        uVar41 = uVar41 + 1;
        lVar46 = lVar46 + lVar21;
        lVar47 = lVar47 + lVar27;
        lVar44 = lVar44 + lVar27;
        lVar67 = lVar67 + lVar37;
        lVar54 = lVar54 + lVar21;
        lVar40 = lVar40 + lVar27;
        lVar24 = lVar24 + lVar27;
        lVar39 = lVar39 + lVar37;
      } while (uVar41 != uVar34);
      if (0 < ncomp) {
        dVar1 = dxinv[2];
        iVar2 = (box->smallend).vect[2];
        lVar24 = *(long *)(box->smallend).vect;
        lVar32 = lVar24 >> 0x20;
        lVar21 = lVar32 * 8;
        iVar43 = (int)lVar24;
        lVar38 = (long)iVar43;
        lVar37 = (lVar21 + (iVar2 - iVar45) * lVar36 * 8 + lVar68 * -8) * lVar35 + lVar38 * 8 +
                 lVar59 * -8 + (long)pdVar14;
        local_1d0 = (lVar21 + (iVar20 - iVar45) * lVar36 * 8 + lVar68 * -8) * lVar35 + lVar38 * 8 +
                    lVar59 * -8 + (long)pdVar14;
        lVar40 = (lVar21 + (int)(~uVar7 + iVar2) * lVar31 * 8 + lVar62 * -8) * lVar26 + lVar38 * 8 +
                 lVar77 * -8 + (long)pdVar18;
        lVar39 = (lVar21 + (int)(iVar2 - uVar7) * lVar31 * 8 + lVar62 * -8) * lVar26 + lVar38 * 8 +
                 lVar77 * -8 + (long)pdVar18;
        local_1e8 = (lVar21 + (int)(iVar72 - uVar7) * lVar31 * 8 + lVar62 * -8) * lVar26 +
                    lVar38 * 8 + lVar77 * -8 + (long)pdVar18;
        local_1f0 = (lVar21 + (int)(iVar20 - uVar7) * lVar31 * 8 + lVar62 * -8) * lVar26 +
                    lVar38 * 8 + lVar77 * -8 + (long)pdVar18;
        uVar19 = *(undefined8 *)(box->bigend).vect;
        iVar28 = (int)uVar19;
        lVar26 = (lVar21 + (iVar2 - iVar4) * lVar30 * 8 + lVar61 * -8) * lVar29 + lVar38 * 8 +
                 lVar49 * -8 + (long)pdVar17;
        local_218 = (lVar21 + (iVar20 - iVar4) * lVar30 * 8 + lVar61 * -8) * lVar29 + lVar38 * 8 +
                    lVar49 * -8 + (long)pdVar17;
        lVar22 = lVar36 * lVar35 * lVar22 * 8;
        lVar21 = lVar30 * lVar29 * lVar25 * 8;
        iVar72 = (iVar28 - iVar43) + 1;
        iVar2 = (int)((ulong)uVar19 >> 0x20);
        uVar41 = 0;
        do {
          iVar20 = (int)((ulong)lVar24 >> 0x20);
          lVar25 = lVar37;
          lVar30 = lVar32;
          lVar31 = lVar26;
          lVar36 = lVar39;
          lVar38 = lVar40;
          if (iVar20 <= iVar2) {
            do {
              if (iVar43 <= iVar28) {
                lVar44 = 0;
                do {
                  *(double *)(lVar31 + lVar44 * 8) =
                       (*(double *)(lVar36 + lVar44 * 8) - *(double *)(lVar38 + lVar44 * 8)) *
                       *(double *)(lVar25 + lVar44 * 8) * -dVar1 * bscalar;
                  lVar44 = lVar44 + 1;
                } while (iVar72 != (int)lVar44);
              }
              lVar30 = lVar30 + 1;
              lVar25 = lVar25 + lVar35 * 8;
              lVar38 = lVar38 + lVar23;
              lVar36 = lVar36 + lVar23;
              lVar31 = lVar31 + lVar29 * 8;
            } while (iVar2 + 1 != (int)lVar30);
            lVar25 = local_1d0;
            lVar30 = lVar32;
            lVar31 = local_218;
            lVar36 = local_1e8;
            lVar38 = local_1f0;
            if (iVar20 <= iVar2) {
              do {
                if (iVar43 <= iVar28) {
                  lVar44 = 0;
                  do {
                    *(double *)(lVar31 + lVar44 * 8) =
                         (*(double *)(lVar38 + lVar44 * 8) - *(double *)(lVar36 + lVar44 * 8)) *
                         *(double *)(lVar25 + lVar44 * 8) * -dVar1 * bscalar;
                    lVar44 = lVar44 + 1;
                  } while (iVar72 != (int)lVar44);
                }
                lVar30 = lVar30 + 1;
                lVar25 = lVar25 + lVar35 * 8;
                lVar36 = lVar36 + lVar23;
                lVar38 = lVar38 + lVar23;
                lVar31 = lVar31 + lVar29 * 8;
              } while (iVar2 + 1 != (int)lVar30);
            }
          }
          uVar41 = uVar41 + 1;
          lVar37 = lVar37 + lVar22;
          lVar40 = lVar40 + lVar27;
          lVar39 = lVar39 + lVar27;
          lVar26 = lVar26 + lVar21;
          local_1d0 = local_1d0 + lVar22;
          local_1e8 = local_1e8 + lVar27;
          local_1f0 = local_1f0 + lVar27;
          local_218 = local_218 + lVar21;
        } while (uVar41 != uVar34);
      }
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::FFlux (Box const& box, Real const* dxinv, Real bscalar,
                        Array<FArrayBox const*, AMREX_SPACEDIM> const& bcoef,
                        Array<FArrayBox*,AMREX_SPACEDIM> const& flux,
                        FArrayBox const& sol, int face_only, int ncomp)
{
    AMREX_D_TERM(const auto bx = bcoef[0]->const_array();,
                 const auto by = bcoef[1]->const_array();,
                 const auto bz = bcoef[2]->const_array(););
    AMREX_D_TERM(const auto& fxarr = flux[0]->array();,
                 const auto& fyarr = flux[1]->array();,
                 const auto& fzarr = flux[2]->array(););
    const auto& solarr = sol.array();

    if (face_only)
    {
        Real fac = bscalar*dxinv[0];
        Box blo = amrex::bdryLo(box, 0);
        int blen = box.length(0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_xface(tbox, fxarr, solarr, bx, fac, blen, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        blo = amrex::bdryLo(box, 1);
        blen = box.length(1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_yface(tbox, fyarr, solarr, by, fac, blen, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        blo = amrex::bdryLo(box, 2);
        blen = box.length(2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_zface(tbox, fzarr, solarr, bz, fac, blen, ncomp);
        });
#endif
    }
    else
    {
        Real fac = bscalar*dxinv[0];
        Box bflux = amrex::surroundingNodes(box, 0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_x(tbox, fxarr, solarr, bx, fac, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        bflux = amrex::surroundingNodes(box, 1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_y(tbox, fyarr, solarr, by, fac, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        bflux = amrex::surroundingNodes(box, 2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_z(tbox, fzarr, solarr, bz, fac, ncomp);
        });
#endif
    }
}